

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_case_name,TestInfo *test_info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  _Alloc_hider _Var3;
  TestInfo *pTVar4;
  int iVar5;
  size_t sVar6;
  ostream *poVar7;
  TestPartResult *pTVar8;
  long *plVar9;
  undefined1 in_CL;
  undefined1 uVar10;
  XmlUnitTestResultPrinter *pXVar11;
  size_type *psVar12;
  TimeInMillis ms;
  TestResult *result;
  long lVar13;
  int i;
  char *pcVar14;
  internal *this;
  int iVar15;
  string location;
  string detail;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string summary;
  string local_c8;
  TestInfo *local_a8;
  string local_a0;
  ostream *local_80;
  string local_78;
  string local_58;
  TestResult *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(stream,"    <testcase name=\"",0x14);
  local_a8 = test_info;
  EscapeXml_abi_cxx11_
            (&local_c8,(XmlUnitTestResultPrinter *)(test_info->name_)._M_dataplus._M_p,(char *)0x1,
             (bool)in_CL);
  _Var3._M_p = local_c8._M_dataplus._M_p;
  if (local_c8._M_dataplus._M_p == (char *)0x0) {
    std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
  }
  else {
    sVar6 = strlen(local_c8._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(stream,_Var3._M_p,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\"",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  pbVar2 = (local_a8->value_param_).ptr_;
  if ((pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar2->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>(stream," value_param=\"",0xe);
    pbVar2 = (local_a8->value_param_).ptr_;
    if (pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pXVar11 = (XmlUnitTestResultPrinter *)0x0;
    }
    else {
      pXVar11 = (XmlUnitTestResultPrinter *)(pbVar2->_M_dataplus)._M_p;
    }
    EscapeXml_abi_cxx11_(&local_c8,pXVar11,(char *)0x1,(bool)in_CL);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,local_c8._M_dataplus._M_p,local_c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  pbVar2 = (local_a8->type_param_).ptr_;
  if ((pbVar2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar2->_M_dataplus)._M_p != (pointer)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>(stream," type_param=\"",0xd);
    pbVar2 = (local_a8->type_param_).ptr_;
    if (pbVar2 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pXVar11 = (XmlUnitTestResultPrinter *)0x0;
    }
    else {
      pXVar11 = (XmlUnitTestResultPrinter *)(pbVar2->_M_dataplus)._M_p;
    }
    EscapeXml_abi_cxx11_(&local_c8,pXVar11,(char *)0x1,(bool)in_CL);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (stream,local_c8._M_dataplus._M_p,local_c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream," status=\"",9);
  pTVar4 = local_a8;
  uVar10 = 0x9d;
  pcVar14 = "notrun";
  if ((ulong)local_a8->should_run_ != 0) {
    pcVar14 = "run";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,pcVar14,((ulong)local_a8->should_run_ ^ 1) * 3 + 3);
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\" time=\"",8);
  FormatTimeInMillisAsSeconds_abi_cxx11_(&local_c8,(internal *)(pTVar4->result_).elapsed_time_,ms);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (stream,local_c8._M_dataplus._M_p,local_c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" classname=\"",0xd);
  EscapeXml_abi_cxx11_
            (&local_58,(XmlUnitTestResultPrinter *)test_case_name,(char *)0x1,(bool)uVar10);
  _Var3._M_p = local_58._M_dataplus._M_p;
  if ((XmlUnitTestResultPrinter *)local_58._M_dataplus._M_p == (XmlUnitTestResultPrinter *)0x0) {
    std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
  }
  else {
    sVar6 = strlen(local_58._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,_Var3._M_p,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\"",1);
  local_38 = &local_a8->result_;
  TestPropertiesAsXmlAttributes_abi_cxx11_(&local_a0,(XmlUnitTestResultPrinter *)local_38,result);
  _Var3._M_p = local_a0._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::ios::clear((int)poVar7 + (int)*(undefined8 *)(*(long *)poVar7 + -0x18));
  }
  else {
    sVar6 = strlen(local_a0._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,_Var3._M_p,sVar6);
  }
  paVar1 = &local_a0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (0 < (int)((ulong)((long)(local_a8->result_).test_part_results_.
                              super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_a8->result_).test_part_results_.
                             super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249) {
    i = 0;
    iVar15 = 0;
    local_80 = stream;
    do {
      iVar5 = (int)local_a8;
      pTVar8 = TestResult::GetTestPartResult(local_38,i);
      if (pTVar8->type_ != kSuccess) {
        if (iVar15 == 0) {
          std::__ostream_insert<char,std::char_traits<char>>(local_80,">\n",2);
        }
        this = (internal *)(pTVar8->file_name_)._M_string_length;
        if (this != (internal *)0x0) {
          this = (internal *)(pTVar8->file_name_)._M_dataplus._M_p;
        }
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  (&local_c8,this,(char *)(ulong)(uint)pTVar8->line_number_,iVar5);
        local_a0._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,local_c8._M_dataplus._M_p,
                   local_c8._M_dataplus._M_p + local_c8._M_string_length);
        std::__cxx11::string::append((char *)&local_a0);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_a0);
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        pXVar11 = (XmlUnitTestResultPrinter *)(plVar9 + 2);
        if ((XmlUnitTestResultPrinter *)*plVar9 == pXVar11) {
          local_58.field_2._M_allocated_capacity =
               (size_type)
               (pXVar11->super_EmptyTestEventListener).super_TestEventListener.
               _vptr_TestEventListener;
          local_58.field_2._8_8_ = plVar9[3];
        }
        else {
          local_58.field_2._M_allocated_capacity =
               (size_type)
               (pXVar11->super_EmptyTestEventListener).super_TestEventListener.
               _vptr_TestEventListener;
          local_58._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_58._M_string_length = plVar9[1];
        *plVar9 = (long)pXVar11;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        uVar10 = SUB81(pXVar11,0);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_80,"      <failure message=\"",0x18);
        EscapeXml_abi_cxx11_
                  (&local_a0,(XmlUnitTestResultPrinter *)local_58._M_dataplus._M_p,(char *)0x1,
                   (bool)uVar10);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_80,local_a0._M_dataplus._M_p,local_a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" type=\"\">",10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,local_c8._M_dataplus._M_p,
                   local_c8._M_dataplus._M_p + local_c8._M_string_length);
        std::__cxx11::string::append((char *)&local_78);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_78);
        psVar12 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_a0.field_2._M_allocated_capacity = *psVar12;
          local_a0.field_2._8_8_ = plVar9[3];
          local_a0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_a0.field_2._M_allocated_capacity = *psVar12;
          local_a0._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_a0._M_string_length = plVar9[1];
        *plVar9 = (long)psVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        RemoveInvalidXmlCharacters(&local_78,&local_a0);
        OutputXmlCDataSection(local_80,local_78._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_80,"</failure>\n",0xb);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        iVar15 = iVar15 + 1;
      }
      i = i + 1;
      iVar5 = (int)((ulong)((long)(local_a8->result_).test_part_results_.
                                  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_a8->result_).test_part_results_.
                                 super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
    } while (SBORROW4(i,iVar5 * -0x49249249) != i + iVar5 * 0x49249249 < 0);
    stream = local_80;
    if (iVar15 != 0) {
      pcVar14 = "    </testcase>\n";
      lVar13 = 0x10;
      goto LAB_0013ab51;
    }
  }
  pcVar14 = " />\n";
  lVar13 = 4;
LAB_0013ab51:
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar14,lVar13);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_case_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  *stream << "    <testcase name=\""
          << EscapeXmlAttribute(test_info.name()).c_str() << "\"";

  if (test_info.value_param() != NULL) {
    *stream << " value_param=\"" << EscapeXmlAttribute(test_info.value_param())
            << "\"";
  }
  if (test_info.type_param() != NULL) {
    *stream << " type_param=\"" << EscapeXmlAttribute(test_info.type_param())
            << "\"";
  }

  *stream << " status=\""
          << (test_info.should_run() ? "run" : "notrun")
          << "\" time=\""
          << FormatTimeInMillisAsSeconds(result.elapsed_time())
          << "\" classname=\"" << EscapeXmlAttribute(test_case_name).c_str()
          << "\"" << TestPropertiesAsXmlAttributes(result).c_str();

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1) {
        *stream << ">\n";
      }
      const string location = internal::FormatCompilerIndependentFileLocation(
          part.file_name(), part.line_number());
      const string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(summary.c_str())
              << "\" type=\"\">";
      const string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0)
    *stream << " />\n";
  else
    *stream << "    </testcase>\n";
}